

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue::~IfcPropertyReferenceValue
          (IfcPropertyReferenceValue *this)

{
  undefined8 *puVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  puVar1 = (undefined8 *)(&this->field_0x0 + lVar2);
  *(undefined ***)(&this->field_0x0 + lVar2) = &PTR__IfcPropertyReferenceValue_008043d8;
  *(undefined ***)(&this->field_0xb0 + lVar2) = &PTR__IfcPropertyReferenceValue_00804450;
  *(undefined ***)(&this->field_0x58 + lVar2) = &PTR__IfcPropertyReferenceValue_00804400;
  *(undefined ***)
   ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
           _vptr_ObjectHelper + lVar2) = &PTR__IfcPropertyReferenceValue_00804428;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)&(this->PropertyReference).
                     super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + lVar2);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((long *)puVar1[0xf] != puVar1 + 0x11) {
    operator_delete((long *)puVar1[0xf],puVar1[0x11] + 1);
  }
  *puVar1 = 0x804568;
  puVar1[0x16] = 0x804590;
  if ((long *)puVar1[6] != puVar1 + 8) {
    operator_delete((long *)puVar1[6],puVar1[8] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
    return;
  }
  return;
}

Assistant:

IfcPropertyReferenceValue() : Object("IfcPropertyReferenceValue") {}